

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O0

bool __thiscall sf::Shader::loadFromFile(Shader *this,string *filename,Type type)

{
  bool bVar1;
  ostream *poVar2;
  int in_EDX;
  string *in_RSI;
  vector<char,_std::allocator<char>_> shader;
  vector<char,_std::allocator<char>_> *in_stack_000001b0;
  string *in_stack_000001b8;
  char *in_stack_00001080;
  char *in_stack_00001088;
  char *in_stack_00001090;
  Shader *in_stack_00001098;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  vector<char,_std::allocator<char>_> local_38;
  int local_1c;
  string *local_18;
  bool local_1;
  
  local_1c = in_EDX;
  local_18 = in_RSI;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x1f717d);
  bVar1 = anon_unknown.dwarf_ff70d::getFileContents(in_stack_000001b8,in_stack_000001b0);
  if (bVar1) {
    if (local_1c == 0) {
      std::vector<char,_std::allocator<char>_>::operator[](&local_38,0);
      local_1 = compile(in_stack_00001098,in_stack_00001090,in_stack_00001088,in_stack_00001080);
    }
    else if (local_1c == 1) {
      in_stack_ffffffffffffff60 = (vector<char,_std::allocator<char>_> *)0x0;
      std::vector<char,_std::allocator<char>_>::operator[](&local_38,0);
      local_1 = compile(in_stack_00001098,in_stack_00001090,in_stack_00001088,in_stack_00001080);
    }
    else {
      std::vector<char,_std::allocator<char>_>::operator[](&local_38,0);
      local_1 = compile(in_stack_00001098,in_stack_00001090,in_stack_00001088,in_stack_00001080);
    }
  }
  else {
    poVar2 = err();
    poVar2 = std::operator<<(poVar2,"Failed to open shader file \"");
    poVar2 = std::operator<<(poVar2,local_18);
    poVar2 = std::operator<<(poVar2,"\"");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_1 = false;
  }
  std::vector<char,_std::allocator<char>_>::~vector(in_stack_ffffffffffffff60);
  return (bool)(local_1 & 1);
}

Assistant:

bool Shader::loadFromFile(const std::string& filename, Type type)
{
    // Read the file
    std::vector<char> shader;
    if (!getFileContents(filename, shader))
    {
        err() << "Failed to open shader file \"" << filename << "\"" << std::endl;
        return false;
    }

    // Compile the shader program
    if (type == Vertex)
        return compile(&shader[0], NULL, NULL);
    else if (type == Geometry)
        return compile(NULL, &shader[0], NULL);
    else
        return compile(NULL, NULL, &shader[0]);
}